

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

error_code llvm::sys::fs::copy_file_internal(int ReadFD,int WriteFD)

{
  int __v;
  void *__buf;
  ssize_t sVar1;
  int *piVar2;
  error_category *__cat;
  error_code eVar3;
  int local_38;
  int local_34;
  int BytesWritten;
  int BytesRead;
  char *Buf;
  size_t BufSize;
  int WriteFD_local;
  int ReadFD_local;
  error_category *local_10;
  
  __buf = operator_new__(0x1000);
  local_38 = 0;
  do {
    sVar1 = read(ReadFD,__buf,0x1000);
    local_34 = (int)sVar1;
    if (local_34 < 1) break;
    for (; local_34 != 0; local_34 = local_34 - local_38) {
      sVar1 = write(WriteFD,__buf,(long)local_34);
      local_38 = (int)sVar1;
      if (local_38 < 0) break;
    }
  } while (-1 < local_38);
  if (__buf != (void *)0x0) {
    operator_delete__(__buf);
  }
  if ((local_34 < 0) || (local_38 < 0)) {
    piVar2 = __errno_location();
    __v = *piVar2;
    __cat = (error_category *)std::_V2::generic_category();
    std::error_code::error_code((error_code *)&WriteFD_local,__v,__cat);
  }
  else {
    std::error_code::error_code((error_code *)&WriteFD_local);
  }
  eVar3._4_4_ = 0;
  eVar3._M_value = WriteFD_local;
  eVar3._M_cat = local_10;
  return eVar3;
}

Assistant:

static std::error_code copy_file_internal(int ReadFD, int WriteFD) {
  const size_t BufSize = 4096;
  char *Buf = new char[BufSize];
  int BytesRead = 0, BytesWritten = 0;
  for (;;) {
    BytesRead = read(ReadFD, Buf, BufSize);
    if (BytesRead <= 0)
      break;
    while (BytesRead) {
      BytesWritten = write(WriteFD, Buf, BytesRead);
      if (BytesWritten < 0)
        break;
      BytesRead -= BytesWritten;
    }
    if (BytesWritten < 0)
      break;
  }
  delete[] Buf;

  if (BytesRead < 0 || BytesWritten < 0)
    return std::error_code(errno, std::generic_category());
  return std::error_code();
}